

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_zip.c
# Opt level: O3

void internal_zip_deconstruct_bytes(uint8_t *scratch,uint8_t *source,uint64_t count)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t *puVar3;
  uint8_t *raw;
  uint8_t *puVar4;
  uint8_t *t1;
  uint8_t *puVar5;
  uint8_t *puVar6;
  
  if (0 < (long)count) {
    puVar3 = scratch + (count + 1 >> 1);
    puVar5 = source;
    puVar6 = scratch;
    do {
      puVar4 = puVar5 + 1;
      *puVar6 = *puVar5;
      if (puVar4 < source + count) {
        puVar4 = puVar5 + 2;
        *puVar3 = puVar5[1];
        puVar3 = puVar3 + 1;
      }
      puVar6 = puVar6 + 1;
      puVar5 = puVar4;
    } while (puVar4 < source + count);
    if (count != 1) {
      puVar5 = scratch + 1;
      uVar2 = *scratch;
      do {
        uVar1 = *puVar5;
        *puVar5 = (uVar1 - uVar2) + 0x80;
        puVar5 = puVar5 + 1;
        uVar2 = uVar1;
      } while (puVar5 < scratch + count);
    }
  }
  return;
}

Assistant:

void internal_zip_deconstruct_bytes (
    uint8_t*       scratch,
    const uint8_t* source,
    uint64_t       count)
{
    int            p;
    uint8_t*       t1   = scratch;
    uint8_t*       t2   = t1 + (count + 1) / 2;
    const uint8_t* raw  = source;
    const uint8_t* stop = raw + count;

    /* reorder */
    while (raw < stop)
    {
        *(t1++) = *(raw++);
        if (raw < stop) *(t2++) = *(raw++);
    }

    /* reorder */
    t1 = scratch;
    t2 = t1 + count;
    t1++;
    p = (int) t1[-1];
    while (t1 < t2)
    {
        int d = (int) (t1[0]) - p + (128 + 256);
        p     = (int) t1[0];
        t1[0] = (uint8_t) d;
        ++t1;
    }
}